

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void __thiscall libchars::debug::~debug(debug *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (_d_ != (FILE *)0x0) {
    fclose(_d_);
    _d_ = (FILE *)0x0;
  }
  pcVar1 = (this->log_path)._M_dataplus._M_p;
  paVar2 = &(this->log_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

debug::~debug()
    {
        if (_d_ != NULL) {
            fclose(_d_);
            _d_ = NULL;
        }
    }